

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string *full_name,void *parent,string *name,Message *proto,
          Symbol symbol)

{
  bool bVar1;
  LogMessage *pLVar2;
  const_iterator cVar3;
  LogLevel_conflict *pLVar4;
  FileDescriptor *pFVar5;
  long *plVar6;
  long lVar7;
  undefined8 *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  Symbol symbol_00;
  Symbol symbol_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  Message *local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  undefined1 local_d0 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pFVar5 = this->file_;
  symbol_00._4_4_ = 0;
  symbol_00.type = symbol.type;
  symbol_00.field_1.descriptor = symbol.field_1.descriptor;
  local_f8 = proto;
  local_78 = name;
  bVar1 = DescriptorPool::Tables::AddSymbol(this->tables_,full_name,symbol_00);
  if (bVar1) {
    if (parent != (void *)0x0) {
      pFVar5 = (FileDescriptor *)parent;
    }
    symbol_01._4_4_ = 0;
    symbol_01.type = symbol.type;
    symbol_01.field_1.descriptor = symbol.field_1.descriptor;
    bVar1 = FileDescriptorTables::AddAliasUnderParent(this->file_tables_,pFVar5,local_78,symbol_01);
    if (!bVar1) {
      if (this->had_errors_ != false) {
        return false;
      }
      internal::LogMessage::LogMessage
                ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                 ,0xf9a);
      pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_d0,"\"");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,full_name);
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,
                          "\" not previously defined in symbols_by_name_, but was defined in symbols_by_parent_; this shouldn\'t be possible."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)local_d0);
      return false;
    }
    return true;
  }
  local_d0._0_8_ = (full_name->_M_dataplus)._M_p;
  cVar3 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->tables_->symbols_by_name_)._M_h,(key_type *)local_d0);
  pLVar4 = (LogLevel_conflict *)
           ((long)cVar3.
                  super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                  ._M_cur + 0x10);
  if (cVar3.super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
      _M_cur == (__node_type *)0x0) {
    pLVar4 = &(anonymous_namespace)::kNullSymbol;
  }
  local_d0._8_8_ = *(anon_union_8_8_13f84498_for_Symbol_2 *)(pLVar4 + 2);
  local_d0._0_4_ = *pLVar4;
  pFVar5 = Symbol::GetFile((Symbol *)local_d0);
  if (pFVar5 != this->file_) {
    std::operator+(&local_98,"\"",full_name);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
    puVar10 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar10) {
      local_e0 = *puVar10;
      lStack_d8 = plVar6[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar10;
      local_f0 = (ulong *)*plVar6;
    }
    local_e8 = plVar6[1];
    *plVar6 = (long)puVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,**(ulong **)pFVar5);
    psVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118.field_2._8_8_ = puVar8[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_118._M_string_length = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar11) {
      local_d0._16_8_ = *psVar11;
      local_d0._24_8_ = plVar6[3];
      local_d0._0_8_ = local_d0 + 0x10;
    }
    else {
      local_d0._16_8_ = *psVar11;
      local_d0._0_8_ = (size_type *)*plVar6;
    }
    local_d0._8_8_ = *(anon_union_8_8_13f84498_for_Symbol_2 *)(plVar6 + 1);
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    AddError(this,full_name,local_f8,NAME,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    paVar9 = &local_98.field_2;
    goto LAB_002c96e8;
  }
  lVar7 = std::__cxx11::string::rfind((char)full_name,0x2e);
  if (lVar7 == -1) {
    std::operator+(&local_118,"\"",full_name);
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    psVar11 = puVar8 + 2;
    if ((size_type *)*puVar8 == psVar11) {
      local_d0._16_8_ = *psVar11;
      local_d0._24_8_ = puVar8[3];
      local_d0._0_8_ = local_d0 + 0x10;
    }
    else {
      local_d0._16_8_ = *psVar11;
      local_d0._0_8_ = (size_type *)*puVar8;
    }
    local_d0._8_8_ = *(anon_union_8_8_13f84498_for_Symbol_2 *)(puVar8 + 1);
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    AddError(this,full_name,local_f8,NAME,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_);
    }
    paVar9 = &local_118.field_2;
    goto LAB_002c96e8;
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)full_name);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x5719ec);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_98.field_2._M_allocated_capacity = *psVar11;
    local_98.field_2._8_8_ = plVar6[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar11;
    local_98._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_98._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
  puVar10 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar10) {
    local_e0 = *puVar10;
    lStack_d8 = puVar8[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar10;
    local_f0 = (ulong *)*puVar8;
  }
  local_e8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_70,(ulong)full_name);
  uVar12 = 0xf;
  if (local_f0 != &local_e0) {
    uVar12 = local_e0;
  }
  if (uVar12 < (ulong)(local_68 + local_e8)) {
    uVar12 = 0xf;
    if (local_70 != local_60) {
      uVar12 = local_60[0];
    }
    if (uVar12 < (ulong)(local_68 + local_e8)) goto LAB_002c9564;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_002c9564:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_118.field_2._M_allocated_capacity = *psVar11;
    local_118.field_2._8_8_ = puVar8[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar11;
    local_118._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_118._M_string_length = puVar8[1];
  *puVar8 = psVar11;
  puVar8[1] = 0;
  *(undefined1 *)psVar11 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
  psVar11 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar11) {
    local_d0._16_8_ = *psVar11;
    local_d0._24_8_ = puVar8[3];
    local_d0._0_8_ = local_d0 + 0x10;
  }
  else {
    local_d0._16_8_ = *psVar11;
    local_d0._0_8_ = (size_type *)*puVar8;
  }
  local_d0._8_8_ = *(anon_union_8_8_13f84498_for_Symbol_2 *)(puVar8 + 1);
  *puVar8 = psVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  AddError(this,full_name,local_f8,NAME,(string *)local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  paVar9 = &local_40;
LAB_002c96e8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar9->_M_allocated_capacity)[-2] != paVar9) {
    operator_delete((undefined1 *)(&paVar9->_M_allocated_capacity)[-2]);
  }
  return false;
}

Assistant:

bool DescriptorBuilder::AddSymbol(const std::string& full_name,
                                  const void* parent, const std::string& name,
                                  const Message& proto, Symbol symbol) {
  // If the caller passed nullptr for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == nullptr) parent = file_;

  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      // This is only possible if there was already an error adding something of
      // the same name.
      if (!had_errors_) {
        GOOGLE_LOG(DFATAL) << "\"" << full_name
                    << "\" not previously defined in "
                       "symbols_by_name_, but was defined in "
                       "symbols_by_parent_; this shouldn't be possible.";
      }
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      std::string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == std::string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name + "\" is already defined.");
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name.substr(dot_pos + 1) +
                     "\" is already defined in \"" +
                     full_name.substr(0, dot_pos) + "\".");
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + full_name + "\" is already defined in file \"" +
                   other_file->name() + "\".");
    }
    return false;
  }
}